

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

int oonf_layer2_neigh_set_nexthop(oonf_layer2_neigh *neigh,netaddr *nexthop)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  oonf_layer2_neigh_mods oVar4;
  uint8_t *__s1;
  long lStack_30;
  
  iVar3 = -1;
  if (nexthop->_type == '\x02') {
    oVar4 = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V4;
    lStack_30 = 0x34;
  }
  else {
    if (nexthop->_type != '\n') {
      return -1;
    }
    oVar4 = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V6;
    lStack_30 = 0x46;
  }
  __s1 = (neigh->key).addr._addr + lStack_30;
  iVar2 = bcmp(__s1,nexthop,0x12);
  if (iVar2 != 0) {
    *(undefined2 *)(__s1 + 0x10) = *(undefined2 *)&nexthop->_type;
    uVar1 = *(undefined8 *)(nexthop->_addr + 8);
    *(undefined8 *)__s1 = *(undefined8 *)nexthop->_addr;
    *(undefined8 *)(__s1 + 8) = uVar1;
    neigh->modified = neigh->modified | oVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
oonf_layer2_neigh_set_nexthop(struct oonf_layer2_neigh *neigh, const struct netaddr *nexthop) {
  enum oonf_layer2_neigh_mods mod;
  struct netaddr *nh;

  switch (netaddr_get_address_family(nexthop)) {
    case AF_INET:
      nh = &neigh->_next_hop_v4;
      mod = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V4;
      break;
    case AF_INET6:
      nh = &neigh->_next_hop_v6;
      mod = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V6;
      break;
    default:
      return -1;
  }

  if (memcmp(nh, nexthop, sizeof(*nexthop)) == 0) {
    return -1;
  }

  memcpy(nh, nexthop, sizeof(*nexthop));
  neigh->modified |= mod;
  return 0;
}